

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageModule.cpp
# Opt level: O0

MessageTemplate * __thiscall
ki::protocol::dml::MessageModule::get_message_template(MessageModule *this,uint8_t type)

{
  size_type sVar1;
  mapped_type *ppMVar2;
  uint8_t local_19;
  MessageModule *pMStack_18;
  uint8_t type_local;
  MessageModule *this_local;
  
  local_19 = type;
  pMStack_18 = this;
  sVar1 = std::
          map<unsigned_char,_ki::protocol::dml::MessageTemplate_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_ki::protocol::dml::MessageTemplate_*>_>_>
          ::count(&this->m_message_type_map,&local_19);
  if (sVar1 == 1) {
    ppMVar2 = std::
              map<unsigned_char,_ki::protocol::dml::MessageTemplate_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_ki::protocol::dml::MessageTemplate_*>_>_>
              ::at(&this->m_message_type_map,&local_19);
    this_local = (MessageModule *)*ppMVar2;
  }
  else {
    this_local = (MessageModule *)0x0;
  }
  return (MessageTemplate *)this_local;
}

Assistant:

const MessageTemplate *MessageModule::get_message_template(uint8_t type) const
	{
		if (m_message_type_map.count(type) == 1)
			return m_message_type_map.at(type);
		return nullptr;
	}